

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void __thiscall deqp::gls::FboUtil::ValidStatusCodes::logRules(ValidStatusCodes *this,TestLog *log)

{
  pointer pRVar1;
  char *pcVar2;
  long lVar3;
  ValidStatusCodes *pVVar4;
  int ndx_1;
  int ndx;
  long lVar5;
  allocator<char> local_8a;
  allocator<char> local_89;
  undefined1 local_88 [32];
  ScopedLogSection section;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defaultRule;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&defaultRule,"Rules",&local_8a);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"Active rules",&local_89);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&defaultRule,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&defaultRule);
  lVar3 = 8;
  for (lVar5 = 0;
      pRVar1 = (this->m_errorCodes).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar5 < (int)(((long)(this->m_errorCodes).
                           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38);
      lVar5 = lVar5 + 1) {
    pcVar2 = glu::getErrorName(*(int *)((long)pRVar1 + lVar3 + -8));
    pVVar4 = (ValidStatusCodes *)&defaultRule;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defaultRule,pcVar2,(allocator<char> *)local_88);
    logRule(pVVar4,log,(string *)&defaultRule,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&((this->m_errorCodes).
                        super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                        ._M_impl.super__Vector_impl_data._M_start)->errorCode + lVar3));
    std::__cxx11::string::~string((string *)&defaultRule);
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 8;
  for (lVar5 = 0;
      pRVar1 = (this->m_errorStatuses).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar5 < (int)(((long)(this->m_errorStatuses).
                           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38);
      lVar5 = lVar5 + 1) {
    pcVar2 = glu::getFramebufferStatusName(*(int *)((long)pRVar1 + lVar3 + -8));
    pVVar4 = (ValidStatusCodes *)&defaultRule;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defaultRule,pcVar2,(allocator<char> *)local_88);
    logRule(pVVar4,log,(string *)&defaultRule,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&((this->m_errorStatuses).
                        super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                        ._M_impl.super__Vector_impl_data._M_start)->errorCode + lVar3));
    std::__cxx11::string::~string((string *)&defaultRule);
    lVar3 = lVar3 + 0x38;
  }
  if (this->m_allowComplete != false) {
    defaultRule._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &defaultRule._M_t._M_impl.super__Rb_tree_header._M_header;
    defaultRule._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    defaultRule._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    defaultRule._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    defaultRule._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         defaultRule._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"FBO is complete",&local_8a);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&defaultRule,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    pVVar4 = (ValidStatusCodes *)local_88;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pVVar4,"GL_FRAMEBUFFER_COMPLETE",&local_8a);
    logRule(pVVar4,log,(string *)local_88,&defaultRule);
    std::__cxx11::string::~string((string *)local_88);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&defaultRule._M_t);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void ValidStatusCodes::logRules (tcu::TestLog& log) const
{
	const tcu::ScopedLogSection section(log, "Rules", "Active rules");

	for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		logRule(log, glu::getErrorName(m_errorCodes[ndx].errorCode), m_errorCodes[ndx].rules);

	for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		logRule(log, glu::getFramebufferStatusName(m_errorStatuses[ndx].errorCode), m_errorStatuses[ndx].rules);

	if (m_allowComplete)
	{
		std::set<std::string> defaultRule;
		defaultRule.insert("FBO is complete");
		logRule(log, "GL_FRAMEBUFFER_COMPLETE", defaultRule);
	}
}